

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBuilder.h
# Opt level: O1

void __thiscall
aeron::BufferBuilder::ensureCapacity(BufferBuilder *this,uint32_t additionalCapacity)

{
  uchar *__src;
  uint32_t uVar1;
  uchar *__dest;
  uint requiredCapacity;
  pointer __old_p;
  
  requiredCapacity = additionalCapacity + this->m_limit;
  if (this->m_capacity < requiredCapacity) {
    uVar1 = findSuitableCapacity(this->m_capacity,requiredCapacity);
    __dest = (uchar *)operator_new__((ulong)uVar1);
    __src = (this->m_buffer)._M_t.
            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    memcpy(__dest,__src,(ulong)this->m_limit);
    (this->m_buffer)._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = __dest;
    if (__src != (uchar *)0x0) {
      operator_delete__(__src);
    }
    this->m_capacity = uVar1;
  }
  return;
}

Assistant:

void ensureCapacity(std::uint32_t additionalCapacity)
    {
        const std::uint32_t requiredCapacity = m_limit + additionalCapacity;

        if (requiredCapacity > m_capacity)
        {
            const std::uint32_t newCapacity = findSuitableCapacity(m_capacity, requiredCapacity);
            std::unique_ptr<std::uint8_t[]> newBuffer(new std::uint8_t[newCapacity]);

            ::memcpy(&newBuffer[0], &m_buffer[0], m_limit);
            m_buffer = std::move(newBuffer);
            m_capacity = newCapacity;
        }
    }